

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

void done_eating(boolean message)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  obj *poVar5;
  boolean bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  
  *(uint *)&(victual.piece)->field_0x4a = *(uint *)&(victual.piece)->field_0x4a | 0x800000;
  occupation = (_func_int *)0x0;
  newuhs('\0');
  if (nomovemsg == (char *)0x0) {
    if (message != '\0') {
      pcVar11 = "draining";
      if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) == 0) {
        pcVar11 = "eating";
      }
      pcVar10 = food_xname(victual.piece,'\x01');
      pline("You finish %s %s.",pcVar11,pcVar10);
    }
  }
  else {
    if (message != '\0') {
      pline(nomovemsg);
    }
    nomovemsg = (char *)0x0;
  }
  poVar5 = victual.piece;
  sVar2 = (victual.piece)->otyp;
  switch(sVar2) {
  case 0x11b:
    make_blinded((ulong)u.ucreamed,'\x01');
    break;
  case 0x11c:
    if ((-1 < u.ulycn) || (((youmonst.data)->mflags2 & 4) != 0)) {
      you_unwere('\x01');
    }
    break;
  case 0x11d:
  case 0x11e:
  case 0x120:
  case 0x121:
    break;
  case 0x11f:
    gainstr(victual.piece,1,'\0');
    iVar4 = u.umonnum;
    iVar3 = u.umonster;
    bVar1 = poVar5->field_0x4a;
    iVar7 = rnd(0x14);
    iVar8 = -iVar7;
    if ((bVar1 & 1) == 0) {
      iVar8 = iVar7;
    }
    if (iVar4 == iVar3) {
      u.uhp = iVar8 + u.uhp;
      if (u.uhpmax < u.uhp) {
        uVar9 = mt_random();
        u.uhp = u.uhpmax;
        if (uVar9 % 0x11 == 0) {
          u.uhp = u.uhpmax + 1;
          u.uhpmax = u.uhp;
        }
      }
      else if (u.uhp < 1) {
        killer_format = 0;
        killer = "rotten lump of royal jelly";
        done(2);
      }
    }
    else {
      u.mh = iVar8 + u.mh;
      if (u.mhmax < u.mh) {
        uVar9 = mt_random();
        u.mh = u.mhmax;
        if (uVar9 % 0x11 == 0) {
          u.mh = u.mhmax + 1;
          u.mhmax = u.mh;
        }
      }
      else if (u.mh < 1) {
        rehumanize();
      }
    }
    if ((poVar5->field_0x4a & 1) == 0) {
      heal_legs();
    }
    break;
  case 0x122:
    if (u.roleplay.illiterate != '\0') {
      pline("This cookie has a scrap of paper inside.");
      pline("What a pity that you cannot read!");
      break;
    }
    iVar8 = bcsign(victual.piece);
    outrumor(iVar8,1);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018f4ce;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018f4c9;
    }
    else {
LAB_0018f4c9:
      if (ublindf == (obj *)0x0) break;
LAB_0018f4ce:
      if (ublindf->oartifact != '\x1d') break;
    }
    violated(8);
    break;
  default:
    if (sVar2 == 0x115) {
      if ((u.uprops[0x1d].intrinsic != 0) && (((victual.piece)->field_0x4a & 1) == 0)) {
        make_sick(0,(char *)0x0,'\x01',3);
      }
      if ((u.uprops[0x2f].intrinsic != 0) && ((poVar5->field_0x4a & 1) == 0)) {
        make_vomiting(0,'\x01');
      }
    }
    else if (sVar2 == 0x10f) {
      if ((((((victual.piece)->corpsenm == 0xc) || ((victual.piece)->corpsenm == 0xb)) &&
           (u.uprops[8].extrinsic == 0)) && (((byte)youmonst.mintrinsics & 0x80) == 0)) &&
         ((bVar6 = poly_when_stoned(youmonst.data), bVar6 == '\0' ||
          (iVar8 = polymon(0x108), iVar8 == 0)))) {
        if (u.uprops[0x21].intrinsic == 0) {
          u.uprops[0x21].intrinsic = 5;
        }
        killer_format = 0;
        pcVar11 = mons_mname(mons + poVar5->corpsenm);
        sprintf(killer_buf,"%s egg",pcVar11);
        delayed_killer = killer_buf;
      }
    }
    else if ((sVar2 == 0x10e) &&
            ((((victual.piece)->field_0x4d & 8) == 0 ||
             ((urace.malenum == 0xe8 && (uVar9 = mt_random(), uVar9 % 5 == 0)))))) {
      cpostfx((victual.piece)->corpsenm);
    }
  }
  if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) == 0) {
    if ((victual.piece)->where == '\x03') {
      useup(victual.piece);
    }
    else {
      useupf(victual.piece,1);
    }
  }
  else {
    *(uint *)&(victual.piece)->field_0x4a = *(uint *)&(victual.piece)->field_0x4a & 0xff7fffff;
  }
  victual.piece = (obj *)0x0;
  victual._20_1_ = victual._20_1_ & 0xf1;
  return;
}

Assistant:

static void done_eating(boolean message)
{
	victual.piece->in_use = TRUE;
	occupation = 0; /* do this early, so newuhs() knows we're done */
	newuhs(FALSE);
	if (nomovemsg) {
		if (message) pline(nomovemsg);
		nomovemsg = 0;
	} else if (message)
		pline("You finish %s %s.",
		      victual.piece->odrained ? "draining" : "eating",
		      food_xname(victual.piece, TRUE));

	if (victual.piece->otyp == CORPSE) {
		if (!victual.piece->odrained || (Race_if(PM_VAMPIRE) && !rn2(5)))
			cpostfx(victual.piece->corpsenm);
	} else {
		fpostfx(victual.piece);
	}

	if (victual.piece->odrained)
		victual.piece->in_use = FALSE;
	else if (carried(victual.piece))
		useup(victual.piece);
	else
		useupf(victual.piece, 1L);
	victual.piece = NULL;
	victual.fullwarn = victual.eating = victual.doreset = FALSE;
}